

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::(anonymous_namespace)::DescriptorDatabaseTest_ConflictingTypeError_Test::
~DescriptorDatabaseTest_ConflictingTypeError_Test
          (DescriptorDatabaseTest_ConflictingTypeError_Test *this)

{
  *(undefined ***)(this + -0x10) = &PTR__DescriptorDatabaseTest_018754a8;
  *(undefined ***)this = &PTR__DescriptorDatabaseTest_018754e8;
  if (*(long **)(this + 8) != (long *)0x0) {
    (**(code **)(**(long **)(this + 8) + 8))();
  }
  *(undefined8 *)(this + 8) = 0;
  testing::Test::~Test((Test *)(this + -0x10));
  operator_delete((Test *)(this + -0x10),0x28);
  return;
}

Assistant:

TEST_P(DescriptorDatabaseTest, ConflictingTypeError) {
  AddToDatabase(
      "name: \"foo.proto\" "
      "message_type { "
      "  name: \"Foo\" "
      "}");
  AddToDatabaseWithError(
      "name: \"bar.proto\" "
      "message_type { "
      "  name: \"Foo\" "
      "}");
}